

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QTableView::dropEvent(QTableView *this,QDropEvent *event)

{
  long *plVar1;
  char cVar2;
  DragDropMode DVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  QTableView *pQVar7;
  iterator iVar8;
  iterator iVar9;
  QAbstractItemModel *pQVar10;
  QPersistentModelIndex *pIndex;
  long lVar11;
  QModelIndex *this_00;
  long in_FS_OFFSET;
  bool bVar12;
  QPersistentModelIndex firstColIndex;
  QPersistentModelIndex dropRow;
  QModelIndex local_b0;
  QArrayDataPointer<QPersistentModelIndex> local_98;
  QArrayDataPointer<QModelIndex> local_78;
  int row;
  int col;
  long local_50 [4];
  
  local_50[3] = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                      super_QWidget.field_0x8;
  pQVar7 = (QTableView *)QDropEvent::source();
  if ((pQVar7 != this) ||
     ((*(int *)(event + 0x2c) != 2 &&
      (DVar3 = QAbstractItemView::dragDropMode((QAbstractItemView *)this), DVar3 != InternalMove))))
  goto LAB_0052eb8f;
  local_50[0] = -1;
  col = -1;
  row = -1;
  local_50[1] = 0;
  local_50[2] = 0;
  if ((event[0xc] != (QDropEvent)0x0) ||
     (cVar2 = (**(code **)(*plVar1 + 0x110))(plVar1,event,&row,&col,local_50), cVar2 == '\0'))
  goto LAB_0052eb8f;
  bVar12 = false;
  if ((-1 < (int)local_50[0]) && (bVar12 = false, -1 < local_50[0])) {
    bVar12 = local_50[2] != 0;
  }
  if ((bVar12) || (col == -1)) goto LAB_0052eb8f;
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d._0_4_ = 0xaaaaaaaa;
  local_78.d._4_4_ = 0xaaaaaaaa;
  local_78.ptr._0_4_ = 0xaaaaaaaa;
  local_78.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x2d8))(&local_78,this);
  local_98.d = (Data *)0x0;
  local_98.ptr = (QPersistentModelIndex *)0x0;
  local_98.size = 0;
  QList<QPersistentModelIndex>::reserve((QList<QPersistentModelIndex> *)&local_98,local_78.size);
  this_00 = (QModelIndex *)CONCAT44(local_78.ptr._4_4_,local_78.ptr._0_4_);
  lVar11 = local_78.size * 0x18;
  do {
    if (lVar11 == 0) {
      iVar8 = QList<QPersistentModelIndex>::begin((QList<QPersistentModelIndex> *)&local_98);
      iVar9 = QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)&local_98);
      std::__sort<QList<QPersistentModelIndex>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
                (iVar8.i,iVar9.i);
      dropRow.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar10 = QAbstractItemView::model((QAbstractItemView *)this);
      (**(code **)(*(long *)pQVar10 + 0x60))(&local_b0,pQVar10,row,col,local_50);
      QPersistentModelIndex::QPersistentModelIndex(&dropRow,&local_b0);
      if (row == -1) {
        pQVar10 = QAbstractItemView::model((QAbstractItemView *)this);
        local_b0.r = -1;
        local_b0.c = -1;
        local_b0.i = 0;
        local_b0.m.ptr = (QAbstractItemModel *)0x0;
        iVar5 = (**(code **)(*(long *)pQVar10 + 0x78))(pQVar10);
      }
      else {
        iVar4 = QPersistentModelIndex::row();
        iVar5 = row;
        if (-1 < iVar4) {
          iVar5 = QPersistentModelIndex::row();
        }
      }
      lVar11 = local_98.size << 3;
      bVar12 = false;
      goto LAB_0052ee16;
    }
    firstColIndex.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::siblingAtColumn(&local_b0,this_00,0);
    QPersistentModelIndex::QPersistentModelIndex(&firstColIndex,&local_b0);
    bVar12 = QListSpecialMethodsBase<QPersistentModelIndex>::contains<QPersistentModelIndex>
                       ((QListSpecialMethodsBase<QPersistentModelIndex> *)&local_98,&firstColIndex);
    if (!bVar12) {
      QList<QPersistentModelIndex>::emplaceBack<QPersistentModelIndex_const&>
                ((QList<QPersistentModelIndex> *)&local_98,&firstColIndex);
    }
    iVar5 = this_00->r;
    iVar4 = (int)local_50[0];
    QPersistentModelIndex::~QPersistentModelIndex(&firstColIndex);
    this_00 = this_00 + 1;
    lVar11 = lVar11 + -0x18;
  } while (iVar5 != iVar4);
  goto LAB_0052eecf;
LAB_0052ee16:
  if (lVar11 == 0) goto LAB_0052eeaf;
  iVar4 = QPersistentModelIndex::row();
  if ((iVar5 == iVar4) || (iVar4 = QPersistentModelIndex::row(), iVar5 == iVar4 + 1)) {
LAB_0052ee93:
    iVar5 = QPersistentModelIndex::row();
    iVar5 = iVar5 + 1;
    bVar12 = true;
  }
  else {
    pQVar10 = QAbstractItemView::model((QAbstractItemView *)this);
    local_b0.r = -1;
    local_b0.c = -1;
    local_b0.i = 0;
    local_b0.m.ptr = (QAbstractItemModel *)0x0;
    uVar6 = QPersistentModelIndex::row();
    firstColIndex.d = (QPersistentModelIndexData *)0xffffffffffffffff;
    cVar2 = (**(code **)(*(long *)pQVar10 + 0x118))(pQVar10,&local_b0,uVar6,1,&firstColIndex,iVar5);
    if (cVar2 != '\0') goto LAB_0052ee93;
  }
  lVar11 = lVar11 + -8;
  goto LAB_0052ee16;
LAB_0052eeaf:
  if (bVar12) {
    *(undefined1 *)((long)plVar1 + 0x3e5) = 1;
    event[0xc] = (QDropEvent)0x1;
  }
  QPersistentModelIndex::~QPersistentModelIndex(&dropRow);
LAB_0052eecf:
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_78);
LAB_0052eb8f:
  if (event[0xc] == (QDropEvent)0x0) {
    QAbstractItemView::dropEvent((QAbstractItemView *)this,event);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_50[3]) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::dropEvent(QDropEvent *event)
{
    Q_D(QTableView);
    if (event->source() == this && (event->dropAction() == Qt::MoveAction ||
                                    dragDropMode() == QAbstractItemView::InternalMove)) {
        QModelIndex topIndex;
        int col = -1;
        int row = -1;
        // check whether a subclass has already accepted the event, ie. moved the data
        if (!event->isAccepted() && d->dropOn(event, &row, &col, &topIndex) && !topIndex.isValid() && col != -1) {
            // Drop between items (reordering) - can only happen with setDragDropOverwriteMode(false)
            const QModelIndexList indexes = selectedIndexes();
            QList<QPersistentModelIndex> persIndexes;
            persIndexes.reserve(indexes.size());

            bool topIndexDropped = false;
            for (const auto &index : indexes) {
                // Reorder entire rows
                QPersistentModelIndex firstColIndex = index.siblingAtColumn(0);
                if (!persIndexes.contains(firstColIndex))
                    persIndexes.append(firstColIndex);
                if (index.row() == topIndex.row()) {
                    topIndexDropped = true;
                    break;
                }
            }
            if (!topIndexDropped) {
                std::sort(persIndexes.begin(), persIndexes.end()); // The dropped items will remain in the same visual order.

                QPersistentModelIndex dropRow = model()->index(row, col, topIndex);

                int r = row == -1 ? model()->rowCount() : (dropRow.row() >= 0 ? dropRow.row() : row);
                bool dataMoved = false;
                for (const QPersistentModelIndex &pIndex : std::as_const(persIndexes)) {
                    // only generate a move when not same row or behind itself
                    if (r != pIndex.row() && r != pIndex.row() + 1) {
                        // try to move (preserves selection)
                        const bool moved = model()->moveRow(QModelIndex(), pIndex.row(), QModelIndex(), r);
                        if (!moved)
                            continue; // maybe it'll work for other rows
                        dataMoved = true; // success
                    } else {
                        // move onto itself is blocked, don't delete anything
                        dataMoved = true;
                    }
                    r = pIndex.row() + 1;   // Dropped items are inserted contiguously and in the right order.
                }
                if (dataMoved) {
                    d->dropEventMoved = true;
                    event->accept();
                }
            }
        }
    }

    if (!event->isAccepted()) {
        // moveRows not implemented, fall back to default
        QAbstractItemView::dropEvent(event);
    }
}